

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O2

void __thiscall
Sinclair::ZX8081::ConcreteMachine<true>::set_options
          (ConcreteMachine<true> *this,
          unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str)

{
  long lVar1;
  
  lVar1 = __dynamic_cast((str->_M_t).
                         super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>
                         .super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl,
                         &Reflection::Struct::typeinfo,&ZX8081::Machine::Options::typeinfo,0);
  set_use_automatic_tape_motor_control(this,*(bool *)(lVar1 + 9));
  this->allow_fast_tape_hack_ = *(bool *)(lVar1 + 8);
  set_use_fast_tape(this);
  return;
}

Assistant:

void set_options(const std::unique_ptr<Reflection::Struct> &str) {
			const auto options = dynamic_cast<Options *>(str.get());
			set_use_automatic_tape_motor_control(options->automatic_tape_motor_control);
			allow_fast_tape_hack_ = options->quickload;
			set_use_fast_tape();
		}